

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

void __thiscall vec3<unsigned_char>::normalize(vec3<unsigned_char> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar7._0_4_ = (this->super_vec3_base).r;
  uVar7._4_4_ = (this->super_vec3_base).g;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar7;
  fVar5 = (this->super_vec3_base).b;
  if (((((float)(undefined4)uVar7 != 128.0) || (NAN((float)(undefined4)uVar7))) ||
      ((float)uVar7._4_4_ != 128.0)) ||
     (((NAN((float)uVar7._4_4_) || (fVar5 != 128.0)) || (NAN(fVar5))))) {
    auVar8 = divps(auVar8,_DAT_001fd470);
    auVar9._0_4_ = auVar8._0_4_ + auVar8._0_4_ + -1.0;
    auVar9._4_4_ = auVar8._4_4_ + auVar8._4_4_ + -1.0;
    auVar9._8_4_ = auVar8._8_4_ + auVar8._8_4_ + 0.0;
    auVar9._12_4_ = auVar8._12_4_ + auVar8._12_4_ + 0.0;
    fVar4 = fVar5 / 255.0 + fVar5 / 255.0 + -1.0;
    auVar8 = minps(_DAT_00201cf0,auVar9);
    uVar7 = CONCAT44(~-(uint)(auVar9._4_4_ < -1.0) & auVar8._4_4_,
                     ~-(uint)(auVar9._0_4_ < -1.0) & auVar8._0_4_) |
            CONCAT44(-(uint)(auVar9._4_4_ < -1.0),-(uint)(auVar9._0_4_ < -1.0)) & 0xbf800000bf800000
    ;
    (this->super_vec3_base).r = (float)(int)uVar7;
    (this->super_vec3_base).g = (float)(int)(uVar7 >> 0x20);
    fVar5 = 1.0;
    if (fVar4 <= 1.0) {
      fVar5 = fVar4;
    }
    (this->super_vec3_base).b =
         (float)(-(uint)(fVar4 < -1.0) & 0xbf800000 | ~-(uint)(fVar4 < -1.0) & (uint)fVar5);
    vec3_base::base_normalize(&this->super_vec3_base);
    uVar1 = (this->super_vec3_base).r;
    uVar2 = (this->super_vec3_base).g;
    fVar5 = floorf(((float)uVar1 + 1.0) * 255.0 * 0.5 + 0.5);
    fVar4 = floorf(((float)uVar2 + 1.0) * 255.0 * 0.5 + 0.5);
    fVar6 = floorf(((this->super_vec3_base).b + 1.0) * 255.0 * 0.5 + 0.5);
    auVar3._4_4_ = fVar4;
    auVar3._0_4_ = fVar5;
    auVar3._8_4_ = extraout_XMM0_Db;
    auVar3._12_4_ = extraout_XMM0_Db_00;
    auVar8 = minps(_DAT_001fd470,auVar3);
    (this->super_vec3_base).r = (float)(-(uint)(0.0 <= fVar5) & auVar8._0_4_);
    (this->super_vec3_base).g = (float)(-(uint)(0.0 <= fVar4) & auVar8._4_4_);
    fVar5 = 255.0;
    if (fVar6 <= 255.0) {
      fVar5 = fVar6;
    }
    (this->super_vec3_base).b = (float)(~-(uint)(fVar6 < 0.0) & (uint)fVar5);
  }
  return;
}

Assistant:

void normalize() {
        // Zero normals in range [-1, 1] can't be normalized
        if (gc_m[i] == r && gc_m[i] == g && gc_m[i] == b) {
            return;
        } else {
            r = (float)(r / (double)gc_s[i]) * 2.0f - 1.0f;
            g = (float)(g / (double)gc_s[i]) * 2.0f - 1.0f;
            b = (float)(b / (double)gc_s[i]) * 2.0f - 1.0f;
            clamp(-1.0f, 1.0f);
            base_normalize();
            r = (std::floor((r + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            g = (std::floor((g + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            b = (std::floor((b + 1.0f) * (float)gc_s[i] * 0.5f + 0.5f));
            clamp(0.0f, (float)gc_s[i]);
        }
    }